

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O3

basic_executor_type<std::allocator<void>,_4UL> * __thiscall
asio::execution::detail::any_executor_base::
target<asio::io_context::basic_executor_type<std::allocator<void>,4ul>>(any_executor_base *this)

{
  char *__s1;
  int iVar1;
  long lVar2;
  target_fns *ptVar3;
  
  if (this->target_fns_ == (target_fns *)0x0) {
    return (basic_executor_type<std::allocator<void>,_4UL> *)0x0;
  }
  lVar2 = (*(code *)**(undefined8 **)&this[1].object_)();
  __s1 = *(char **)(lVar2 + 8);
  if (__s1 == "N4asio10io_context19basic_executor_typeISaIvELm4EEE") {
LAB_001caad9:
    ptVar3 = this->target_fns_;
  }
  else {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,"N4asio10io_context19basic_executor_typeISaIvELm4EEE");
      if (iVar1 == 0) goto LAB_001caad9;
    }
    ptVar3 = (target_fns *)0x0;
  }
  return (basic_executor_type<std::allocator<void>,_4UL> *)ptVar3;
}

Assistant:

const Executor* target() const
  {
    return target_ && (is_same<Executor, void>::value
        || target_fns_->target_type() == target_type_ex<Executor>())
      ? static_cast<const Executor*>(target_) : 0;
  }